

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
md::ROM::get_words(vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
                  ROM *this,uint32_t begin,uint32_t end)

{
  uint16_t local_3a;
  uint32_t local_38;
  uint32_t addr;
  undefined1 local_21;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t end_local;
  uint32_t begin_local;
  ROM *this_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output;
  
  local_21 = 0;
  local_20 = end;
  local_1c = begin;
  _end_local = this;
  this_local = (ROM *)__return_storage_ptr__;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (__return_storage_ptr__,(ulong)((local_20 - local_1c >> 1) + 1));
  for (local_38 = local_1c; local_38 < local_20; local_38 = local_38 + 2) {
    local_3a = get_word(this,local_38);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (__return_storage_ptr__,&local_3a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> ROM::get_words(uint32_t begin, uint32_t end) const
{
    std::vector<uint16_t> output;
    output.reserve(((end - begin) / 0x2) + 1);

    for (uint32_t addr = begin; addr < end; addr += 0x2)
        output.emplace_back(this->get_word(addr));

    return output;
}